

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetOrthAA(void *kinmem,int orthaa)

{
  int in_ESI;
  KINMem in_RDI;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0xb7,"KINSetOrthAA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if ((in_ESI < 0) || (3 < in_ESI)) {
    KINProcessError(in_RDI,-2,0xbf,"KINSetOrthAA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"Illegal value for orthaa.");
    local_4 = -2;
  }
  else {
    in_RDI->kin_orth_aa = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINSetOrthAA(void* kinmem, int orthaa)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if ((orthaa < KIN_ORTH_MGS) || (orthaa > KIN_ORTH_DCGS2))
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_ORTHAA);
    return (KIN_ILL_INPUT);
  }

  kin_mem->kin_orth_aa = orthaa;

  return (KIN_SUCCESS);
}